

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmsdemo.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  int iVar1;
  FILE *this;
  double input;
  double dVar2;
  double error;
  double output_signal;
  double canceller;
  double ref_noise;
  double input_signal;
  int i;
  FILE *foutput;
  FILE *finput;
  Fir1 fir;
  double in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff6c;
  Fir1 *in_stack_ffffffffffffff70;
  double local_60;
  int local_54;
  FILE *local_50;
  FILE *local_48;
  Fir1 local_30;
  int local_4;
  
  local_4 = 0;
  Fir1::Fir1(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
  Fir1::setLearningRate(&local_30,0.0005);
  local_48 = fopen("ecg50hz.dat","rt");
  this = fopen("ecg_filtered.dat","wt");
  local_54 = 0;
  local_50 = this;
  while( true ) {
    iVar1 = __isoc99_fscanf(local_48,"%lf\n",&local_60);
    if (iVar1 < 1) break;
    input = sin((double)local_54 * 0.3141592653589793);
    dVar2 = Fir1::filter(&local_30,input);
    error = local_60 - dVar2;
    Fir1::lms_update(&local_30,error);
    fprintf(local_50,"%f %f %f\n",error,dVar2,input);
    local_54 = local_54 + 1;
  }
  fclose(local_48);
  fclose(local_50);
  fprintf(_stderr,"Written the filtered ECG to \'ecg_filtered.dat\'\n");
  Fir1::~Fir1((Fir1 *)this);
  return local_4;
}

Assistant:

int main (int,char**)
{
	// inits the filter
	Fir1 fir(NTAPS);
	fir.setLearningRate(LEARNING_RATE);

	FILE *finput = fopen("ecg50hz.dat","rt");
	FILE *foutput = fopen("ecg_filtered.dat","wt");
	for(int i=0;;i++) 
	{
		double input_signal;		
		if (fscanf(finput,"%lf\n",&input_signal)<1) break;
		double ref_noise = sin(2*M_PI/20*i);
		double canceller = fir.filter(ref_noise);
		double output_signal = input_signal - canceller;
		fir.lms_update(output_signal);
		fprintf(foutput,"%f %f %f\n",output_signal,canceller,ref_noise);
	}
	fclose(finput);
	fclose(foutput);
	fprintf(stderr,"Written the filtered ECG to 'ecg_filtered.dat'\n");
}